

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_MtDataEncoder_PutOneofField(upb_MtDataEncoder *e,char *ptr,uint32_t field_num)

{
  char cVar1;
  char cVar2;
  upb_MtDataEncoderInternal *puVar3;
  char *pcVar4;
  upb_MtDataEncoderInternal *in;
  char *pcStack_20;
  uint32_t field_num_local;
  char *ptr_local;
  upb_MtDataEncoder *e_local;
  
  puVar3 = upb_MtDataEncoder_GetInternal(e,ptr);
  pcStack_20 = ptr;
  if ((puVar3->state).msg_state.oneof_state == kUpb_OneofState_EmittedOneofField) {
    cVar1 = _upb_FromBase92('|');
    pcStack_20 = upb_MtDataEncoder_Put(e,ptr,cVar1);
    if (pcStack_20 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  cVar1 = _upb_ToBase92('\0');
  cVar2 = _upb_ToBase92('?');
  pcVar4 = upb_MtDataEncoder_PutBase92Varint(e,pcStack_20,field_num,(int)cVar1,(int)cVar2);
  (puVar3->state).msg_state.oneof_state = kUpb_OneofState_EmittedOneofField;
  return pcVar4;
}

Assistant:

char* upb_MtDataEncoder_PutOneofField(upb_MtDataEncoder* e, char* ptr,
                                      uint32_t field_num) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  if (in->state.msg_state.oneof_state == kUpb_OneofState_EmittedOneofField) {
    ptr = upb_MtDataEncoder_Put(
        e, ptr, _upb_FromBase92(kUpb_EncodedValue_FieldSeparator));
    if (!ptr) return NULL;
  }
  ptr = upb_MtDataEncoder_PutBase92Varint(e, ptr, field_num, _upb_ToBase92(0),
                                          _upb_ToBase92(63));
  in->state.msg_state.oneof_state = kUpb_OneofState_EmittedOneofField;
  return ptr;
}